

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O3

void xmrig::cryptonight_triple_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cryptonight_ctx *pcVar7;
  cryptonight_ctx *pcVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  cryptonight_ctx *pcVar11;
  uint8_t *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t i_1;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  size_t i;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  double dVar40;
  undefined1 auVar43 [16];
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long lVar46;
  undefined1 auVar47 [16];
  long lVar48;
  long lVar49;
  undefined1 auVar50 [16];
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  long lVar68;
  long lVar71;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long local_178;
  ulong local_138;
  
  lVar37 = 0;
  do {
    pcVar7 = ctx[lVar37];
    keccak(input,(int)size,pcVar7->state,200);
    cn_explode_scratchpad<false>((__m128i *)pcVar7,(__m128i *)pcVar7->memory);
    lVar37 = lVar37 + 1;
    input = input + size;
  } while (lVar37 != 3);
  pcVar7 = *ctx;
  pcVar8 = ctx[1];
  puVar9 = pcVar7->memory;
  puVar10 = pcVar8->memory;
  pcVar11 = ctx[2];
  puVar12 = pcVar11->memory;
  local_138 = *(ulong *)(pcVar7->state + 0x60);
  local_178 = *(long *)(pcVar7->state + 0x68);
  auVar45 = *(undefined1 (*) [16])pcVar7->state;
  auVar44 = *(undefined1 (*) [16])(pcVar7->state + 0x10);
  auVar50 = *(undefined1 (*) [16])(pcVar7->state + 0x20);
  auVar67 = *(undefined1 (*) [16])(pcVar7->state + 0x30);
  uVar41 = *(ulong *)(pcVar7->state + 0x40);
  uVar42 = *(ulong *)(pcVar7->state + 0x48);
  uVar27 = *(ulong *)(pcVar7->state + 0x50);
  uVar23 = *(ulong *)(pcVar7->state + 0x58);
  uVar33 = *(ulong *)(pcVar8->state + 0x60);
  lVar37 = *(long *)(pcVar8->state + 0x68);
  auVar43 = *(undefined1 (*) [16])pcVar8->state;
  auVar6 = *(undefined1 (*) [16])(pcVar8->state + 0x10);
  auVar73 = *(undefined1 (*) [16])(pcVar8->state + 0x20);
  auVar60 = *(undefined1 (*) [16])(pcVar8->state + 0x30);
  uVar21 = *(ulong *)(pcVar8->state + 0x40);
  uVar25 = *(ulong *)(pcVar8->state + 0x48);
  uVar62 = *(ulong *)(pcVar8->state + 0x50);
  uVar63 = *(ulong *)(pcVar8->state + 0x58);
  uVar72 = *(ulong *)(pcVar11->state + 0x60);
  lVar28 = *(long *)(pcVar11->state + 0x68);
  auVar5 = *(undefined1 (*) [16])pcVar11->state;
  auVar4 = *(undefined1 (*) [16])(pcVar11->state + 0x10);
  auVar47 = *(undefined1 (*) [16])(pcVar11->state + 0x20);
  auVar58 = *(undefined1 (*) [16])(pcVar11->state + 0x30);
  uVar30 = *(ulong *)(pcVar11->state + 0x40);
  uVar31 = *(ulong *)(pcVar11->state + 0x48);
  uVar19 = *(ulong *)(pcVar11->state + 0x50);
  uVar20 = *(ulong *)(pcVar11->state + 0x58);
  fesetround(0x400);
  uVar26 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar26 != 0) {
    auVar47 = auVar47 ^ auVar5;
    auVar73 = auVar73 ^ auVar43;
    auVar50 = auVar50 ^ auVar45;
    uVar24 = auVar50._0_8_;
    uVar18 = auVar73._0_8_;
    uVar22 = auVar47._0_8_;
    auVar67 = auVar67 ^ auVar44;
    auVar58 = auVar58 ^ auVar4;
    auVar60 = auVar60 ^ auVar6;
    uVar21 = uVar62 ^ uVar21;
    uVar25 = uVar63 ^ uVar25;
    uVar62 = uVar19 ^ uVar30;
    uVar63 = uVar20 ^ uVar31;
    uVar41 = uVar27 ^ uVar41;
    uVar42 = uVar23 ^ uVar42;
    do {
      uVar24 = uVar24 & 0xffff0;
      uVar18 = uVar18 & 0xffff0;
      uVar22 = uVar22 & 0xffff0;
      lVar13 = *(long *)((long)(puVar9 + (uVar24 ^ 0x30)) + 8);
      auVar4 = *(undefined1 (*) [16])(puVar9 + uVar24);
      auVar5 = *(undefined1 (*) [16])(puVar10 + uVar18);
      auVar6 = *(undefined1 (*) [16])(puVar12 + uVar22);
      lVar14 = *(long *)(puVar9 + (uVar24 ^ 0x10));
      lVar15 = *(long *)((long)(puVar9 + (uVar24 ^ 0x10)) + 8);
      lVar16 = *(long *)(puVar9 + (uVar24 ^ 0x20));
      lVar17 = *(long *)((long)(puVar9 + (uVar24 ^ 0x20)) + 8);
      *(ulong *)(puVar9 + (uVar24 ^ 0x10)) = *(long *)(puVar9 + (uVar24 ^ 0x30)) + uVar41;
      *(ulong *)((long)(puVar9 + (uVar24 ^ 0x10)) + 8) = lVar13 + uVar42;
      uVar52 = auVar67._0_8_;
      uVar53 = auVar67._8_8_;
      *(ulong *)(puVar9 + (uVar24 ^ 0x20)) = lVar14 + uVar52;
      *(ulong *)((long)(puVar9 + (uVar24 ^ 0x20)) + 8) = lVar15 + uVar53;
      auVar65 = aesenc(auVar4,auVar50);
      lVar49 = auVar50._0_8_;
      lVar51 = auVar50._8_8_;
      *(long *)(puVar9 + (uVar24 ^ 0x30)) = lVar16 + lVar49;
      *(long *)((long)(puVar9 + (uVar24 ^ 0x30)) + 8) = lVar17 + lVar51;
      *(undefined1 (*) [16])(puVar9 + uVar24) = auVar65 ^ auVar67;
      lVar13 = *(long *)((long)(puVar10 + (uVar18 ^ 0x30)) + 8);
      lVar14 = *(long *)(puVar10 + (uVar18 ^ 0x10));
      lVar15 = *(long *)((long)(puVar10 + (uVar18 ^ 0x10)) + 8);
      lVar16 = *(long *)(puVar10 + (uVar18 ^ 0x20));
      lVar17 = *(long *)((long)(puVar10 + (uVar18 ^ 0x20)) + 8);
      *(ulong *)(puVar10 + (uVar18 ^ 0x10)) = *(long *)(puVar10 + (uVar18 ^ 0x30)) + uVar21;
      *(ulong *)((long)(puVar10 + (uVar18 ^ 0x10)) + 8) = lVar13 + uVar25;
      uVar56 = auVar60._0_8_;
      uVar57 = auVar60._8_8_;
      *(ulong *)(puVar10 + (uVar18 ^ 0x20)) = lVar14 + uVar56;
      *(ulong *)((long)(puVar10 + (uVar18 ^ 0x20)) + 8) = lVar15 + uVar57;
      auVar61 = aesenc(auVar5,auVar73);
      lVar68 = auVar73._0_8_;
      lVar71 = auVar73._8_8_;
      *(long *)(puVar10 + (uVar18 ^ 0x30)) = lVar16 + lVar68;
      *(long *)((long)(puVar10 + (uVar18 ^ 0x30)) + 8) = lVar17 + lVar71;
      *(undefined1 (*) [16])(puVar10 + uVar18) = auVar61 ^ auVar60;
      lVar13 = *(long *)((long)(puVar12 + (uVar22 ^ 0x30)) + 8);
      lVar14 = *(long *)(puVar12 + (uVar22 ^ 0x10));
      lVar15 = *(long *)((long)(puVar12 + (uVar22 ^ 0x10)) + 8);
      lVar16 = *(long *)(puVar12 + (uVar22 ^ 0x20));
      lVar17 = *(long *)((long)(puVar12 + (uVar22 ^ 0x20)) + 8);
      *(ulong *)(puVar12 + (uVar22 ^ 0x10)) = *(long *)(puVar12 + (uVar22 ^ 0x30)) + uVar62;
      *(ulong *)((long)(puVar12 + (uVar22 ^ 0x10)) + 8) = lVar13 + uVar63;
      uVar54 = auVar58._0_8_;
      uVar55 = auVar58._8_8_;
      *(ulong *)(puVar12 + (uVar22 ^ 0x20)) = lVar14 + uVar54;
      *(ulong *)((long)(puVar12 + (uVar22 ^ 0x20)) + 8) = lVar15 + uVar55;
      lVar46 = auVar47._0_8_;
      lVar48 = auVar47._8_8_;
      *(long *)(puVar12 + (uVar22 ^ 0x30)) = lVar16 + lVar46;
      *(long *)((long)(puVar12 + (uVar22 ^ 0x30)) + 8) = lVar17 + lVar48;
      auVar59 = aesenc(auVar6,auVar47);
      *(undefined1 (*) [16])(puVar12 + uVar22) = auVar59 ^ auVar58;
      uVar23 = auVar65._0_8_;
      uVar39 = uVar23 & 0xffff0;
      uVar36 = local_178 << 0x20 ^ local_138 ^ *(ulong *)(puVar9 + uVar39);
      uVar27 = (ulong)(auVar65._0_4_ + (int)local_178 * 2 & 0x7ffffffe) | 0x80000001;
      local_138 = auVar65._8_8_ % uVar27 << 0x20 | auVar65._8_8_ / uVar27 & 0xffffffff;
      dVar40 = SQRT((double)(local_138 + uVar23 >> 0xc | 0x3ff0000000000000));
      uVar34 = auVar61._0_8_;
      uVar19 = auVar59._0_8_;
      uVar27 = (ulong)dVar40 >> 0x14;
      uVar30 = (ulong)dVar40 >> 0x13;
      uVar35 = uVar34 & 0xffff0;
      uVar38 = uVar19 & 0xffff0;
      local_178 = uVar30 + (((uVar30 - uVar27) + -0x3fdffffffff) * (uVar27 - 0x3fe00000000) <
                           local_138 + uVar23);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar36;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar23;
      uVar18 = SUB168(auVar67 * auVar4,8);
      uVar20 = SUB168(auVar67 * auVar4,0);
      uVar24 = uVar39 ^ 0x20;
      uVar27 = *(ulong *)(puVar9 + uVar24);
      uVar23 = *(ulong *)(puVar9 + uVar24 + 8);
      uVar30 = *(ulong *)(puVar9 + (uVar39 ^ 0x10));
      uVar31 = *(ulong *)((long)(puVar9 + (uVar39 ^ 0x10)) + 8);
      lVar13 = *(long *)((long)(puVar9 + (uVar39 ^ 0x30)) + 8);
      lVar14 = *(long *)(puVar9 + uVar24);
      lVar15 = *(long *)((long)(puVar9 + uVar24) + 8);
      uVar32 = lVar37 << 0x20 ^ uVar33 ^ *(ulong *)(puVar10 + uVar35);
      uVar1 = *(undefined8 *)(puVar9 + uVar39 + 8);
      uVar22 = lVar28 << 0x20 ^ uVar72 ^ *(ulong *)(puVar12 + uVar38);
      uVar2 = *(undefined8 *)(puVar10 + uVar35 + 8);
      uVar3 = *(undefined8 *)(puVar12 + uVar38 + 8);
      *(ulong *)(puVar9 + (uVar39 ^ 0x10)) = uVar41 + *(long *)(puVar9 + (uVar39 ^ 0x30));
      *(ulong *)((long)(puVar9 + (uVar39 ^ 0x10)) + 8) = uVar42 + lVar13;
      *(ulong *)(puVar9 + uVar24) = (uVar18 ^ uVar30) + uVar52;
      *(ulong *)((long)(puVar9 + uVar24) + 8) = (uVar20 ^ uVar31) + uVar53;
      *(long *)(puVar9 + (uVar39 ^ 0x30)) = lVar14 + lVar49;
      *(long *)((long)(puVar9 + (uVar39 ^ 0x30)) + 8) = lVar15 + lVar51;
      auVar66._0_8_ = (uVar18 ^ uVar27) + lVar49;
      auVar66._8_8_ = (uVar20 ^ uVar23) + lVar51;
      uVar31 = (ulong)(auVar61._0_4_ + (int)lVar37 * 2 & 0x7ffffffe) | 0x80000001;
      *(undefined1 (*) [16])(puVar9 + uVar39) = auVar66;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar32;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar34;
      uVar23 = SUB168(auVar58 * auVar5,8);
      uVar27 = SUB168(auVar58 * auVar5,0);
      uVar30 = uVar35 ^ 0x20;
      uVar33 = *(ulong *)(puVar10 + uVar30);
      uVar72 = *(ulong *)(puVar10 + uVar30 + 8);
      lVar37 = *(long *)((long)(puVar10 + (uVar35 ^ 0x30)) + 8);
      uVar41 = *(ulong *)(puVar10 + (uVar35 ^ 0x10));
      uVar42 = *(ulong *)((long)(puVar10 + (uVar35 ^ 0x10)) + 8);
      lVar13 = *(long *)(puVar10 + uVar30);
      lVar14 = *(long *)((long)(puVar10 + uVar30) + 8);
      *(ulong *)(puVar10 + (uVar35 ^ 0x10)) = uVar21 + *(long *)(puVar10 + (uVar35 ^ 0x30));
      *(ulong *)((long)(puVar10 + (uVar35 ^ 0x10)) + 8) = uVar25 + lVar37;
      *(ulong *)(puVar10 + uVar30) = (uVar23 ^ uVar41) + uVar56;
      *(ulong *)((long)(puVar10 + uVar30) + 8) = (uVar27 ^ uVar42) + uVar57;
      *(long *)(puVar10 + (uVar35 ^ 0x30)) = lVar13 + lVar68;
      *(long *)((long)(puVar10 + (uVar35 ^ 0x30)) + 8) = lVar14 + lVar71;
      auVar64._0_8_ = (uVar23 ^ uVar33) + lVar68;
      auVar64._8_8_ = (uVar27 ^ uVar72) + lVar71;
      *(undefined1 (*) [16])(puVar10 + uVar35) = auVar64;
      uVar33 = (ulong)(auVar59._0_4_ + (int)lVar28 * 2 & 0x7ffffffe) | 0x80000001;
      auVar50._8_8_ = uVar1;
      auVar50._0_8_ = uVar36;
      uVar72 = auVar59._8_8_ / uVar33 & 0xffffffff | auVar59._8_8_ % uVar33 << 0x20;
      uVar33 = auVar61._8_8_ / uVar31 & 0xffffffff | auVar61._8_8_ % uVar31 << 0x20;
      auVar50 = auVar50 ^ auVar66;
      auVar69._0_8_ = uVar19 + uVar72;
      auVar69._8_8_ = uVar34 + uVar33;
      auVar43._0_8_ = auVar69._0_8_ >> 0xc;
      auVar43._8_8_ = auVar69._8_8_ >> 0xc;
      auVar67 = sqrtpd(auVar66,auVar43 | _DAT_0018f250);
      uVar31 = auVar67._0_8_ >> 0x13;
      uVar20 = auVar67._8_8_ >> 0x13;
      uVar41 = auVar67._0_8_ >> 0x14;
      uVar27 = auVar67._8_8_ >> 0x14;
      uVar42 = uVar41 - 0x3fe00000000;
      uVar23 = uVar27 - 0x3fe00000000;
      uVar41 = (uVar31 - uVar41) - 0x3fdffffffff;
      uVar27 = (uVar20 - uVar27) - 0x3fdffffffff;
      auVar74._0_8_ =
           (uVar41 & 0xffffffff) * (uVar42 & 0xffffffff) +
           ((uVar41 >> 0x20) * (uVar42 & 0xffffffff) + (uVar42 >> 0x20) * (uVar41 & 0xffffffff) <<
           0x20);
      auVar74._8_8_ =
           (uVar27 & 0xffffffff) * (uVar23 & 0xffffffff) +
           ((uVar27 >> 0x20) * (uVar23 & 0xffffffff) + (uVar23 >> 0x20) * (uVar27 & 0xffffffff) <<
           0x20);
      auVar69 = auVar69 ^ _DAT_0018bc00;
      auVar74 = auVar74 ^ _DAT_0018bc00;
      auVar44._0_4_ = -(uint)(auVar69._0_4_ == auVar74._0_4_);
      auVar44._4_4_ = -(uint)(auVar69._4_4_ == auVar74._4_4_);
      auVar44._8_4_ = -(uint)(auVar69._8_4_ == auVar74._8_4_);
      auVar44._12_4_ = -(uint)(auVar69._12_4_ == auVar74._12_4_);
      auVar70._0_4_ = -(uint)(auVar74._0_4_ < auVar69._0_4_);
      auVar70._4_4_ = -(uint)(auVar74._4_4_ < auVar69._4_4_);
      auVar70._8_4_ = -(uint)(auVar74._8_4_ < auVar69._8_4_);
      auVar70._12_4_ = -(uint)(auVar74._12_4_ < auVar69._12_4_);
      auVar75._4_4_ = auVar70._0_4_;
      auVar75._0_4_ = auVar70._0_4_;
      auVar75._8_4_ = auVar70._8_4_;
      auVar75._12_4_ = auVar70._8_4_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar22;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar19;
      uVar25 = SUB168(auVar60 * auVar6,8);
      uVar21 = SUB168(auVar60 * auVar6,0);
      uVar30 = uVar38 ^ 0x20;
      uVar41 = *(ulong *)(puVar12 + uVar30);
      uVar42 = *(ulong *)(puVar12 + uVar30 + 8);
      uVar27 = *(ulong *)(puVar12 + (uVar38 ^ 0x10));
      uVar23 = *(ulong *)((long)(puVar12 + (uVar38 ^ 0x10)) + 8);
      lVar37 = *(long *)((long)(puVar12 + (uVar38 ^ 0x30)) + 8);
      lVar28 = *(long *)(puVar12 + uVar30);
      lVar13 = *(long *)((long)(puVar12 + uVar30) + 8);
      *(ulong *)(puVar12 + (uVar38 ^ 0x10)) = uVar62 + *(long *)(puVar12 + (uVar38 ^ 0x30));
      *(ulong *)((long)(puVar12 + (uVar38 ^ 0x10)) + 8) = uVar63 + lVar37;
      *(ulong *)(puVar12 + uVar30) = (uVar25 ^ uVar27) + uVar54;
      *(ulong *)((long)(puVar12 + uVar30) + 8) = (uVar21 ^ uVar23) + uVar55;
      *(long *)(puVar12 + (uVar38 ^ 0x30)) = lVar28 + lVar46;
      *(long *)((long)(puVar12 + (uVar38 ^ 0x30)) + 8) = lVar13 + lVar48;
      uVar29 = movmskpd((int)uVar30,auVar75 & auVar44 | auVar70);
      auVar45._0_8_ = (uVar25 ^ uVar41) + lVar46;
      auVar45._8_8_ = (uVar21 ^ uVar42) + lVar48;
      lVar37 = (uVar20 & 0xffffffff) + (ulong)(byte)((byte)uVar29 >> 1);
      lVar28 = uVar31 + (uVar29 & 1);
      *(undefined1 (*) [16])(puVar12 + uVar38) = auVar45;
      auVar73._8_8_ = uVar2;
      auVar73._0_8_ = uVar32;
      uVar24 = auVar50._0_8_;
      auVar73 = auVar73 ^ auVar64;
      uVar18 = auVar73._0_8_;
      auVar47._8_8_ = uVar3;
      auVar47._0_8_ = uVar22;
      auVar47 = auVar47 ^ auVar45;
      uVar22 = auVar47._0_8_;
      uVar26 = uVar26 - 1;
      auVar67 = auVar65;
      auVar58 = auVar59;
      auVar60 = auVar61;
      uVar21 = uVar56;
      uVar25 = uVar57;
      uVar62 = uVar54;
      uVar63 = uVar55;
      uVar41 = uVar52;
      uVar42 = uVar53;
    } while (uVar26 != 0);
  }
  lVar37 = 0;
  do {
    pcVar7 = ctx[lVar37];
    cn_implode_scratchpad<false>((__m128i *)pcVar7->memory,(__m128i *)pcVar7);
    keccakf((uint64_t *)pcVar7,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar7->state & 3])(pcVar7,200,output);
    lVar37 = lVar37 + 1;
    output = output + 0x20;
  } while (lVar37 != 3);
  return;
}

Assistant:

inline void cryptonight_triple_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 3; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
    }

    for (size_t i = 0; i < 3; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}